

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector3.cpp
# Opt level: O2

ostream * operator<<(ostream *out,Vector3 *v)

{
  ostream *poVar1;
  
  std::operator<<(out,'(');
  poVar1 = std::ostream::_M_insert<double>(v->x);
  std::operator<<(poVar1,' ');
  poVar1 = std::ostream::_M_insert<double>(v->y);
  std::operator<<(poVar1,' ');
  poVar1 = std::ostream::_M_insert<double>(v->z);
  poVar1 = std::operator<<(poVar1,')');
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Vector3& v)
{
    return out << '(' << v.x << ' ' << v.y << ' ' << v.z << ')';
}